

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::~TreeEnsembleRegressor(TreeEnsembleRegressor *this)

{
  ~TreeEnsembleRegressor(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TreeEnsembleRegressor::~TreeEnsembleRegressor() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.TreeEnsembleRegressor)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}